

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeExtractValues.cpp
# Opt level: O1

void __thiscall BatchResultValues::~BatchResultValues(BatchResultValues *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  CaseValues *pCVar2;
  pointer pNVar3;
  pointer pcVar4;
  pointer ppCVar5;
  
  ppCVar5 = (this->m_caseValues).super__Vector_base<CaseValues_*,_std::allocator<CaseValues_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppCVar5 !=
      (this->m_caseValues).super__Vector_base<CaseValues_*,_std::allocator<CaseValues_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      pCVar2 = *ppCVar5;
      if (pCVar2 != (CaseValues *)0x0) {
        pNVar3 = (pCVar2->values).
                 super__Vector_base<xe::ri::NumericValue,_std::allocator<xe::ri::NumericValue>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (pNVar3 != (pointer)0x0) {
          operator_delete(pNVar3,(long)(pCVar2->values).
                                       super__Vector_base<xe::ri::NumericValue,_std::allocator<xe::ri::NumericValue>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)pNVar3);
        }
        pcVar4 = (pCVar2->statusDetails)._M_dataplus._M_p;
        paVar1 = &(pCVar2->statusDetails).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar4 != paVar1) {
          operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
        }
        pcVar4 = (pCVar2->casePath)._M_dataplus._M_p;
        paVar1 = &(pCVar2->casePath).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar4 != paVar1) {
          operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
        }
        operator_delete(pCVar2,0x60);
      }
      ppCVar5 = ppCVar5 + 1;
    } while (ppCVar5 !=
             (this->m_caseValues).super__Vector_base<CaseValues_*,_std::allocator<CaseValues_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  ppCVar5 = (this->m_caseValues).super__Vector_base<CaseValues_*,_std::allocator<CaseValues_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppCVar5 != (pointer)0x0) {
    operator_delete(ppCVar5,(long)(this->m_caseValues).
                                  super__Vector_base<CaseValues_*,_std::allocator<CaseValues_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppCVar5)
    ;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->m_tagNames);
  return;
}

Assistant:

~BatchResultValues (void)
	{
		for (vector<CaseValues*>::iterator i = m_caseValues.begin(); i != m_caseValues.end(); ++i)
			delete *i;
	}